

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLEVER.cpp
# Opt level: O1

void __thiscall
CLEVER::addAlignment
          (CLEVER *this,
          unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> *alignment_autoptr,
          int *edgecounter,int *nonEdgeCounter,int numGCAllowedPos,int ct)

{
  size_t *psVar1;
  AlignmentRecord *this_00;
  AlignmentRecord **ppAVar2;
  EdgeCalculator *pEVar3;
  AlignmentRecord *this_01;
  LogWriter *this_02;
  clique_list_t *pcVar4;
  pointer puVar5;
  Clique *this_03;
  set<std::pair<unsigned_int,_unsigned_long>,_std::less<std::pair<unsigned_int,_unsigned_long>_>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  *psVar6;
  undefined8 uVar7;
  _func_int **pp_Var8;
  char cVar9;
  bool bVar10;
  int iVar11;
  alignment_id_t aVar12;
  alignment_id_t v2;
  uint uVar13;
  _Rb_tree_node_base *p_Var14;
  size_type sVar15;
  CliqueFinder *this_04;
  Clique *pCVar16;
  _List_node_base *p_Var17;
  undefined8 *puVar18;
  CLEVER *pCVar19;
  _List_node_base *p_Var20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  vector<Clique_*,_std::allocator<Clique_*>_> new_cliques;
  Clique *clique;
  unique_ptr<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  intersection;
  Clique *split_off_clique;
  alignment_set_t adjacent;
  pair<unsigned_int,_unsigned_long> local_b8;
  Clique **local_a8;
  _Head_base<0UL,_Clique_*,_false> local_a0;
  CLEVER *local_98;
  Clique local_90;
  int *local_60;
  int *local_58;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  
  local_90.alignment_set = (alignment_set_t *)CONCAT44(local_90.alignment_set._4_4_,ct);
  aVar12 = (this->super_CliqueFinder).next_id;
  (this->super_CliqueFinder).next_id = aVar12 + 1;
  this_00 = (alignment_autoptr->_M_t).
            super___uniq_ptr_impl<AlignmentRecord,_std::default_delete<AlignmentRecord>_>._M_t.
            super__Tuple_impl<0UL,_AlignmentRecord_*,_std::default_delete<AlignmentRecord>_>.
            super__Head_base<0UL,_AlignmentRecord_*,_false>._M_head_impl;
  (alignment_autoptr->_M_t).
  super___uniq_ptr_impl<AlignmentRecord,_std::default_delete<AlignmentRecord>_>._M_t.
  super__Tuple_impl<0UL,_AlignmentRecord_*,_std::default_delete<AlignmentRecord>_>.
  super__Head_base<0UL,_AlignmentRecord_*,_false>._M_head_impl = (AlignmentRecord *)0x0;
  local_90.rightmost_segment_end._4_4_ = numGCAllowedPos;
  local_60 = edgecounter;
  local_58 = nonEdgeCounter;
  AlignmentRecord::setID(this_00,aVar12);
  if ((this->super_CliqueFinder).alignment_count == this->capacity) {
    reorganize_storage(this);
  }
  local_90.alignment_count = (this->super_CliqueFinder).alignment_count;
  ppAVar2 = this->alignments;
  (this->super_CliqueFinder).alignment_count = local_90.alignment_count + 1;
  ppAVar2[local_90.alignment_count] = this_00;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_50,this->capacity,0,(allocator<unsigned_long> *)&local_b8);
  p_Var14 = (this->alignments_by_length)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  psVar6 = &this->alignments_by_length;
  local_98 = this;
  local_b8.second = local_90.alignment_count;
  while (local_90.alignment_count = local_b8.second,
        (_Rb_tree_header *)p_Var14 != &(psVar6->_M_t)._M_impl.super__Rb_tree_header) {
    pEVar3 = (this->super_CliqueFinder).edge_calculator;
    this_01 = this->alignments[(long)p_Var14[1]._M_parent];
    iVar11 = (*pEVar3->_vptr_EdgeCalculator[2])
                       (pEVar3,this_00,this_01,(ulong)local_90.rightmost_segment_end._4_4_,
                        (ulong)local_90.alignment_set & 0xffffffff);
    cVar9 = (char)iVar11;
    if ((cVar9 != '\0') &&
       (pEVar3 = (local_98->super_CliqueFinder).second_edge_calculator,
       pEVar3 != (EdgeCalculator *)0x0)) {
      iVar11 = (*pEVar3->_vptr_EdgeCalculator[2])
                         (pEVar3,this_00,this_01,(ulong)local_90.rightmost_segment_end._4_4_,
                          (ulong)local_90.alignment_set & 0xffffffff);
      cVar9 = (char)iVar11;
    }
    if (cVar9 == '\0') {
      *local_58 = *local_58 + 1;
    }
    else {
      *local_60 = *local_60 + 1;
      local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[(ulong)p_Var14[1]._M_parent >> 6] =
           local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start[(ulong)p_Var14[1]._M_parent >> 6] |
           1L << ((byte)p_Var14[1]._M_parent & 0x3f);
      this_02 = local_98->lw;
      if (this_02 != (LogWriter *)0x0) {
        aVar12 = AlignmentRecord::getID(this_00);
        v2 = AlignmentRecord::getID(this_01);
        LogWriter::reportEdge(this_02,aVar12,v2);
      }
      (local_98->super_CliqueFinder).converged = false;
    }
    this = local_98;
    p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    local_b8.second = local_90.alignment_count;
  }
  local_b8._0_8_ = (ulong)(uint)local_b8._4_4_ << 0x20;
  std::
  _Rb_tree<std::pair<unsigned_int,unsigned_long>,std::pair<unsigned_int,unsigned_long>,std::_Identity<std::pair<unsigned_int,unsigned_long>>,std::less<std::pair<unsigned_int,unsigned_long>>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
  ::_M_insert_unique<std::pair<unsigned_int,unsigned_long>>
            ((_Rb_tree<std::pair<unsigned_int,unsigned_long>,std::pair<unsigned_int,unsigned_long>,std::_Identity<std::pair<unsigned_int,unsigned_long>>,std::less<std::pair<unsigned_int,unsigned_long>>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
              *)&this->alignments_by_length,&local_b8);
  pcVar4 = (this->super_CliqueFinder).cliques;
  p_Var17 = (pcVar4->super__List_base<Clique_*,_std::allocator<Clique_*>_>)._M_impl._M_node.
            super__List_node_base._M_next;
  local_b8._0_8_ = (Clique **)0x0;
  local_b8.second = 0;
  local_a8 = (Clique **)0x0;
  if (p_Var17 != (_List_node_base *)pcVar4) {
    do {
      local_a0._M_head_impl = (Clique *)p_Var17[1]._M_next;
      uVar25 = (local_a0._M_head_impl)->rightmost_segment_end;
      uVar13 = AlignmentRecord::getIntervalStart(this_00);
      if (uVar25 < uVar13) {
        p_Var20 = (((_List_base<Clique_*,_std::allocator<Clique_*>_> *)&p_Var17->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next;
        psVar1 = &(((this->super_CliqueFinder).cliques)->
                  super__List_base<Clique_*,_std::allocator<Clique_*>_>)._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var17);
        local_90.leftmost_segment_start = (size_t)local_a0._M_head_impl;
        CliqueCollector::add
                  ((this->super_CliqueFinder).clique_collector,
                   (unique_ptr<Clique,_std::default_delete<Clique>_> *)
                   &local_90.leftmost_segment_start,this->appearanceMap);
        if ((Clique *)local_90.leftmost_segment_start != (Clique *)0x0) {
          (*(*(_func_int ***)local_90.leftmost_segment_start)[1])();
        }
        local_90.leftmost_segment_start = 0;
      }
      else {
        Clique::intersect(&local_90,(alignment_set_t *)local_a0._M_head_impl);
        puVar5 = (((buffer_type *)local_90._vptr_Clique)->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar21 = (long)(((buffer_type *)local_90._vptr_Clique)->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar5;
        bVar10 = lVar21 != 0;
        if (lVar21 == 0) {
LAB_00150e05:
          if (bVar10) goto LAB_00150e0d;
LAB_00150ec4:
          p_Var20 = p_Var17->_M_next;
        }
        else {
          uVar25 = lVar21 >> 3;
          if (*puVar5 == 0) {
            uVar22 = 1;
            do {
              uVar23 = uVar22;
              if (uVar25 + (uVar25 == 0) == uVar23) break;
              uVar22 = uVar23 + 1;
            } while (puVar5[uVar23] == 0);
            bVar10 = uVar23 < uVar25;
            goto LAB_00150e05;
          }
LAB_00150e0d:
          sVar15 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                             ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                              local_90._vptr_Clique);
          if (sVar15 != (local_a0._M_head_impl)->alignment_count) {
            this_04 = (CliqueFinder *)operator_new(0x30);
            Clique::Clique((Clique *)this_04,&this->super_CliqueFinder,
                           (unique_ptr<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)&local_90);
            local_90.parent = this_04;
            Clique::add((Clique *)this_04,local_90.alignment_count);
            if ((Clique **)local_b8.second == local_a8) {
              std::vector<Clique*,std::allocator<Clique*>>::_M_realloc_insert<Clique*const&>
                        ((vector<Clique*,std::allocator<Clique*>> *)&local_b8,
                         (iterator)local_b8.second,(Clique **)&local_90.parent);
            }
            else {
              *(CliqueFinder **)local_b8.second = local_90.parent;
              local_b8.second = local_b8.second + 8;
            }
            goto LAB_00150ec4;
          }
          Clique::add(local_a0._M_head_impl,local_90.alignment_count);
          if ((Clique **)local_b8.second == local_a8) {
            std::vector<Clique*,std::allocator<Clique*>>::_M_realloc_insert<Clique*const&>
                      ((vector<Clique*,std::allocator<Clique*>> *)&local_b8,
                       (iterator)local_b8.second,&local_a0._M_head_impl);
          }
          else {
            *(Clique **)local_b8.second = local_a0._M_head_impl;
            local_b8.second = local_b8.second + 8;
          }
          p_Var20 = p_Var17->_M_next;
          psVar1 = &(((this->super_CliqueFinder).cliques)->
                    super__List_base<Clique_*,_std::allocator<Clique_*>_>)._M_impl._M_node._M_size;
          *psVar1 = *psVar1 - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var17);
        }
        pp_Var8 = local_90._vptr_Clique;
        if ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_90._vptr_Clique
            != (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
          puVar5 = (((buffer_type *)local_90._vptr_Clique)->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar5 != (pointer)0x0) {
            operator_delete(puVar5);
          }
          operator_delete(pp_Var8);
        }
      }
      p_Var17 = p_Var20;
    } while (p_Var20 != (_List_node_base *)(this->super_CliqueFinder).cliques);
  }
  if (local_b8.second == local_b8._0_8_) {
    pCVar16 = (Clique *)operator_new(0x30);
    Clique::Clique(pCVar16,&this->super_CliqueFinder,local_90.alignment_count,this->capacity);
    local_a0._M_head_impl = pCVar16;
    if ((Clique **)local_b8.second == local_a8) {
      std::vector<Clique*,std::allocator<Clique*>>::_M_realloc_insert<Clique*>
                ((vector<Clique*,std::allocator<Clique*>> *)&local_b8,(iterator)local_b8.second,
                 &local_a0._M_head_impl);
    }
    else {
      *(Clique **)local_b8.second = pCVar16;
      local_b8.second = local_b8.second + 8;
    }
  }
  if (local_b8.second != local_b8._0_8_) {
    lVar21 = 8;
    uVar25 = 0;
    do {
      pCVar16 = *(Clique **)(local_b8._0_8_ + uVar25 * 8);
      if ((pCVar16 != (Clique *)0x0) &&
         (uVar22 = uVar25 + 1, uVar22 < (ulong)((long)(local_b8.second - local_b8._0_8_) >> 3))) {
        local_90.alignment_set = (alignment_set_t *)(uVar25 * 8);
        lVar24 = lVar21;
        do {
          this_03 = *(Clique **)(local_b8._0_8_ + uVar22 * 8);
          if (this_03 != (Clique *)0x0) {
            if (this_03->alignment_count < pCVar16->alignment_count) {
              bVar10 = Clique::contains(pCVar16,this_03);
              if (bVar10) {
                (*this_03->_vptr_Clique[1])(this_03);
                puVar18 = (undefined8 *)(local_b8._0_8_ + lVar24);
                iVar11 = 0xc;
                goto LAB_00150ff9;
              }
LAB_00151002:
              iVar11 = 0;
            }
            else {
              bVar10 = Clique::contains(this_03,pCVar16);
              if (!bVar10) goto LAB_00151002;
              (*pCVar16->_vptr_Clique[1])(pCVar16);
              puVar18 = (undefined8 *)(local_b8._0_8_ + (long)local_90.alignment_set);
              iVar11 = 10;
LAB_00150ff9:
              *puVar18 = 0;
            }
            if ((iVar11 != 0xc) && (iVar11 != 0)) break;
          }
          uVar22 = uVar22 + 1;
          lVar24 = lVar24 + 8;
        } while (uVar22 < (ulong)((long)(local_b8.second - local_b8._0_8_) >> 3));
      }
      uVar25 = uVar25 + 1;
      lVar21 = lVar21 + 8;
    } while (uVar25 < (ulong)((long)(local_b8.second - local_b8._0_8_) >> 3));
  }
  if (local_b8.second != local_b8._0_8_) {
    uVar25 = 0;
    pCVar19 = local_98;
    do {
      uVar7 = local_b8._0_8_;
      if (*(Clique **)(local_b8._0_8_ + uVar25 * 8) != (Clique *)0x0) {
        pcVar4 = (pCVar19->super_CliqueFinder).cliques;
        p_Var17 = (_List_node_base *)operator_new(0x18);
        p_Var17[1]._M_next = (_List_node_base *)*(Clique **)(uVar7 + uVar25 * 8);
        std::__detail::_List_node_base::_M_hook(p_Var17);
        psVar1 = &(pcVar4->super__List_base<Clique_*,_std::allocator<Clique_*>_>)._M_impl._M_node.
                  _M_size;
        *psVar1 = *psVar1 + 1;
        pCVar19 = local_98;
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < (ulong)((long)(local_b8.second - local_b8._0_8_) >> 3));
  }
  if ((Clique **)local_b8._0_8_ != (Clique **)0x0) {
    operator_delete((void *)local_b8._0_8_);
  }
  if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CLEVER::addAlignment(std::unique_ptr<AlignmentRecord>& alignment_autoptr, int& edgecounter, int& nonEdgeCounter, int numGCAllowedPos, int ct) {
    assert(alignment_autoptr.get() != 0);
	assert(cliques!=0);
    assert(initialized);

	alignment_id_t id = next_id++;
	AlignmentRecord* alignment = alignment_autoptr.release();
	alignment->setID(id);

	// store new alignment
	if (alignment_count==capacity) {
		reorganize_storage();
	}
	size_t index = alignment_count++;
	alignments[index] = alignment;

	// TODO: Once edge criteria are fixed, we can try to (re-)gain some efficiency here...
// 	if (single_end) {
		
// 	} else {
// 		alignments_by_length.insert(make_pair(alignment->getInsertLength(), index));
// 	}
	// determine all edges from current alignment pair
	alignment_set_t adjacent(capacity);
	// determine range of insert lengths to be searched
	typedef set<length_and_index_t>::const_iterator iterator_t;
	iterator_t it = alignments_by_length.begin();
	iterator_t end = alignments_by_length.end();
	// iterate through all alignments
	for (; it!=end; ++it) {
		const AlignmentRecord* alignment2 = alignments[it->second];

        //if(alignment->getName().find("normal14") != string::npos && alignment2->getName().find("normal14") != string::npos){
        //       int k = 0;
        //}
		// cerr << "  comparing to " << alignments[it->second]->getID() << ", length " << it->first << ", read group: " << alignments[it->second]->getReadGroup();
        bool set_edge = edge_calculator.edgeBetween(*alignment, *alignment2,numGCAllowedPos,ct);
        //if(a1.getName().find("Clique") != string::npos && a2.getName().find("Clique") != string::npos){
        //FOR DEBUGGING
        //}
        if (set_edge && (second_edge_calculator != nullptr)) {
            set_edge = second_edge_calculator->edgeBetween(*alignment,*alignment2,numGCAllowedPos,ct);
		}
		if (set_edge) {
            edgecounter++;
            //cout << "Edge: " << alignment->getName() << " and " << alignment2->getName() << endl;
			adjacent.set(it->second, true);
			// cerr << " --> EDGE";
			if (lw != nullptr) {
                lw->reportEdge(alignment->getID(), alignment2->getID());
            }
            converged = false;
        }else{
            nonEdgeCounter++;
        }
		// cerr << endl;
	}

    alignments_by_length.insert(make_pair(0, index));

	// iterate over all active cliques. output those that lie left of current segment and
	// check intersection with current node for the rest
	clique_list_t::iterator clique_it = cliques->begin();
	// cliques that contain the newly added alignment and
	// therefore need to be checked for subset relations,
	// i.e. if one of these cliques is contained in another,
	// it must be discarded as it is not maximal.
	vector<Clique*> new_cliques;
	while (clique_it!=cliques->end()) {
		Clique* clique = *clique_it;
		if (clique->rightmostSegmentEnd() < alignment->getIntervalStart()) {
			clique_it = cliques->erase(clique_it);
            clique_collector.add(unique_ptr<Clique>(clique),this->appearanceMap);
		} else {
			// is there an intersection between nodes adjacent to the new
			// alignment and the currently considered clique?
			unique_ptr<alignment_set_t> intersection = clique->intersect(adjacent);
			if (intersection->any()) {
				// is node adjacent to all nodes in the clique?
				if (intersection->count() == clique->size()) {
					// cout << "   Adding to clique " << (*clique) << endl;
					clique->add(index);
					new_cliques.push_back(clique);
					clique_it = cliques->erase(clique_it);
				} else {
					Clique* split_off_clique = new Clique(*this, intersection);
					split_off_clique->add(index);
					// cout << "   Splitting off clique " << (*clique) << " --> " << (*split_off_clique) << endl;
					new_cliques.push_back(split_off_clique);
					++clique_it;
				}
			} else {
				// cout << "   Empty intersection for clique " << (*clique) << endl;
				++clique_it;
			}
		}
	}
	// if current alignment has not been assigned to at least one
	// of the existing cliques, let it form its own singleton clique
	if (new_cliques.size() == 0) {
		new_cliques.push_back(new Clique(*this, index, capacity));
	}

	// check for subset relations and delete cliques that are subsets of others
	for (size_t i=0; i<new_cliques.size(); ++i) {
		if (new_cliques[i]==0) continue;
		Clique* clique_i = new_cliques[i];
		for (size_t j=i+1; j<new_cliques.size(); ++j) {
			if (new_cliques[j]==0) continue;
			Clique* clique_j = new_cliques[j];
			if (clique_i->size()<=clique_j->size()) {
				if (clique_j->contains(*clique_i)) {
					// cout << "Removing duplicate or non-maximal clique!" << endl;
					delete clique_i;
					new_cliques[i] = nullptr;
					break;
				}
			} else {
				if (clique_i->contains(*clique_j)) {
					// cout << "Removing duplicate or non-maximal clique!" << endl;
					delete clique_j;
					new_cliques[j] = nullptr;
					continue;
				}
			}
		}
	}
	//double cpu_time = (double) (clock() - clock_start) / CLOCKS_PER_SEC;
	//int clique_size_new = 0;
	for (size_t i=0; i<new_cliques.size(); ++i) {
		if (new_cliques[i]!=nullptr) {
			cliques->push_back(new_cliques[i]);
			//clique_size_new++;
		}
	}

	//cout << cliques->size() << "\t" << alignment_count << "\t" << clique_size_old << "\t" << clique_size_new << "\t" << cpu_time << "\t" << no_sort << endl;
    /*cout << "  Current Alignments: ";
	for (size_t i=0; i<alignment_count; ++i) {
		cout << alignments[i]->getID() << " ";
	}
	cout << endl;
	cout << "  Current cliques:"<<  endl;
	for (clique_it = cliques->begin();clique_it!=cliques->end(); ++clique_it) {
		cout << "    " << **clique_it << endl;
    }*/

}